

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeNonAtomicLoad(TranslateToFuzzReader *this,Type type)

{
  byte bVar1;
  Expression *pEVar2;
  TranslateToFuzzReader *type_00;
  int8_t iVar3;
  bool bVar4;
  BasicType BVar5;
  Index IVar6;
  uint uVar7;
  reference pvVar8;
  pointer pMVar9;
  Address local_170;
  TranslateToFuzzReader *local_168;
  size_t local_160;
  char *local_158;
  Type local_150;
  Address local_148;
  size_t local_140;
  char *local_138;
  Type local_130;
  Address local_128;
  size_t local_120;
  char *local_118;
  Type local_110;
  Address local_108;
  size_t local_100;
  char *local_f8;
  Type local_f0;
  Address local_e8;
  size_t local_e0;
  char *local_d8;
  Type local_d0;
  Address local_c8;
  size_t local_c0;
  char *local_b8;
  Type local_b0;
  Address local_a8;
  byte local_99;
  size_t sStack_98;
  bool signed__1;
  char *local_90;
  Type local_88;
  Address local_80;
  size_t local_78;
  char *local_70;
  Type local_68;
  Address local_60;
  size_t local_58;
  char *local_50;
  Type local_48;
  Address local_40;
  byte local_31;
  Expression *pEStack_30;
  bool signed_;
  Expression *ptr;
  TranslateToFuzzReader *pTStack_20;
  Index offset;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  pTStack_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  iVar3 = get(this);
  ptr._4_4_ = logify(this,(int)iVar3);
  pEStack_30 = makePointer(this);
  BVar5 = Type::getBasic((Type *)&this_local);
  switch(BVar5) {
  case none:
  case unreachable:
    wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0x696);
  case i32:
    local_31 = get(this);
    local_31 = local_31 & 1;
    IVar6 = upTo(this,3);
    bVar1 = local_31;
    if (IVar6 == 0) {
      Address::Address(&local_40,(ulong)ptr._4_4_);
      pEVar2 = pEStack_30;
      local_48.id = (uintptr_t)this_local;
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                             *)(this->wasm + 0x78),0);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8)
      ;
      local_58 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
      local_50 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
      type_local.id =
           (uintptr_t)
           Builder::makeLoad(&this->builder,1,(bool)(bVar1 & 1),local_40,1,pEVar2,local_48,
                             (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str);
    }
    else if (IVar6 == 1) {
      Address::Address(&local_60,(ulong)ptr._4_4_);
      uVar7 = pick<int,int>(this,1,2);
      pEVar2 = pEStack_30;
      local_68.id = (uintptr_t)this_local;
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                             *)(this->wasm + 0x78),0);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8)
      ;
      local_78 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
      local_70 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
      type_local.id =
           (uintptr_t)
           Builder::makeLoad(&this->builder,2,(bool)(bVar1 & 1),local_60,uVar7,pEVar2,local_68,
                             (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str);
    }
    else {
      if (IVar6 != 2) {
        wasm::handle_unreachable
                  ("unexpected value",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0x662);
      }
      Address::Address(&local_80,(ulong)ptr._4_4_);
      uVar7 = pick<int,int,int>(this,1,2,4);
      pEVar2 = pEStack_30;
      local_88.id = (uintptr_t)this_local;
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                             *)(this->wasm + 0x78),0);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8)
      ;
      sStack_98 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
      local_90 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
      type_local.id =
           (uintptr_t)
           Builder::makeLoad(&this->builder,4,(bool)(bVar1 & 1),local_80,uVar7,pEVar2,local_88,
                             (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str);
    }
    break;
  case i64:
    local_99 = get(this);
    local_99 = local_99 & 1;
    IVar6 = upTo(this,4);
    bVar1 = local_99;
    switch(IVar6) {
    case 0:
      Address::Address(&local_a8,(ulong)ptr._4_4_);
      pEVar2 = pEStack_30;
      local_b0.id = (uintptr_t)this_local;
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                             *)(this->wasm + 0x78),0);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8)
      ;
      local_c0 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
      local_b8 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
      type_local.id =
           (uintptr_t)
           Builder::makeLoad(&this->builder,1,(bool)(bVar1 & 1),local_a8,1,pEVar2,local_b0,
                             (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str);
      break;
    case 1:
      Address::Address(&local_c8,(ulong)ptr._4_4_);
      uVar7 = pick<int,int>(this,1,2);
      pEVar2 = pEStack_30;
      local_d0.id = (uintptr_t)this_local;
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                             *)(this->wasm + 0x78),0);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8)
      ;
      local_e0 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
      local_d8 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
      type_local.id =
           (uintptr_t)
           Builder::makeLoad(&this->builder,2,(bool)(bVar1 & 1),local_c8,uVar7,pEVar2,local_d0,
                             (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str);
      break;
    case 2:
      Address::Address(&local_e8,(ulong)ptr._4_4_);
      uVar7 = pick<int,int,int>(this,1,2,4);
      pEVar2 = pEStack_30;
      local_f0.id = (uintptr_t)this_local;
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                             *)(this->wasm + 0x78),0);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8)
      ;
      local_100 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
      local_f8 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
      type_local.id =
           (uintptr_t)
           Builder::makeLoad(&this->builder,4,(bool)(bVar1 & 1),local_e8,uVar7,pEVar2,local_f0,
                             (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str);
      break;
    case 3:
      Address::Address(&local_108,(ulong)ptr._4_4_);
      uVar7 = pick<int,int,int,int>(this,1,2,4,8);
      pEVar2 = pEStack_30;
      local_110.id = (uintptr_t)this_local;
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                             *)(this->wasm + 0x78),0);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8)
      ;
      local_120 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
      local_118 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
      type_local.id =
           (uintptr_t)
           Builder::makeLoad(&this->builder,8,(bool)(bVar1 & 1),local_108,uVar7,pEVar2,local_110,
                             (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str);
      break;
    default:
      wasm::handle_unreachable
                ("unexpected value",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x67e);
    }
    break;
  case f32:
    Address::Address(&local_128,(ulong)ptr._4_4_);
    uVar7 = pick<int,int,int>(this,1,2,4);
    pEVar2 = pEStack_30;
    local_130.id = (uintptr_t)this_local;
    pvVar8 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                           *)(this->wasm + 0x78),0);
    pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8);
    local_140 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
    local_138 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
    type_local.id =
         (uintptr_t)
         Builder::makeLoad(&this->builder,4,false,local_128,uVar7,pEVar2,local_130,
                           (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str);
    break;
  case f64:
    Address::Address(&local_148,(ulong)ptr._4_4_);
    uVar7 = pick<int,int,int,int>(this,1,2,4,8);
    pEVar2 = pEStack_30;
    local_150.id = (uintptr_t)this_local;
    pvVar8 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                           *)(this->wasm + 0x78),0);
    pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8);
    local_160 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_len;
    local_158 = (pMVar9->super_Importable).super_Named.name.super_IString.str._M_str;
    type_local.id =
         (uintptr_t)
         Builder::makeLoad(&this->builder,8,false,local_148,uVar7,pEVar2,local_150,
                           (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str);
    break;
  case v128:
    bVar4 = FeatureSet::hasSIMD((FeatureSet *)(this->wasm + 0x108));
    if (bVar4) {
      Address::Address(&local_170,(ulong)ptr._4_4_);
      uVar7 = pick<int,int,int,int,int>(this,1,2,4,8,0x10);
      type_00 = this_local;
      pEVar2 = pEStack_30;
      pvVar8 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                             *)(this->wasm + 0x78),0);
      pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar8)
      ;
      type_local.id =
           (uintptr_t)
           Builder::makeLoad(&this->builder,0x10,false,local_170,uVar7,pEVar2,(Type)type_00,
                             (Name)(pMVar9->super_Importable).super_Named.name.super_IString.str);
    }
    else {
      local_168 = this_local;
      type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
    }
    break;
  default:
    wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0x698);
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeNonAtomicLoad(Type type) {
  auto offset = logify(get());
  auto ptr = makePointer();
  switch (type.getBasic()) {
    case Type::i32: {
      bool signed_ = get() & 1;
      switch (upTo(3)) {
        case 0:
          return builder.makeLoad(
            1, signed_, offset, 1, ptr, type, wasm.memories[0]->name);
        case 1:
          return builder.makeLoad(
            2, signed_, offset, pick(1, 2), ptr, type, wasm.memories[0]->name);
        case 2:
          return builder.makeLoad(4,
                                  signed_,
                                  offset,
                                  pick(1, 2, 4),
                                  ptr,
                                  type,
                                  wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("unexpected value");
    }
    case Type::i64: {
      bool signed_ = get() & 1;
      switch (upTo(4)) {
        case 0:
          return builder.makeLoad(
            1, signed_, offset, 1, ptr, type, wasm.memories[0]->name);
        case 1:
          return builder.makeLoad(
            2, signed_, offset, pick(1, 2), ptr, type, wasm.memories[0]->name);
        case 2:
          return builder.makeLoad(4,
                                  signed_,
                                  offset,
                                  pick(1, 2, 4),
                                  ptr,
                                  type,
                                  wasm.memories[0]->name);
        case 3:
          return builder.makeLoad(8,
                                  signed_,
                                  offset,
                                  pick(1, 2, 4, 8),
                                  ptr,
                                  type,
                                  wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("unexpected value");
    }
    case Type::f32: {
      return builder.makeLoad(
        4, false, offset, pick(1, 2, 4), ptr, type, wasm.memories[0]->name);
    }
    case Type::f64: {
      return builder.makeLoad(
        8, false, offset, pick(1, 2, 4, 8), ptr, type, wasm.memories[0]->name);
    }
    case Type::v128: {
      if (!wasm.features.hasSIMD()) {
        return makeTrivial(type);
      }
      return builder.makeLoad(16,
                              false,
                              offset,
                              pick(1, 2, 4, 8, 16),
                              ptr,
                              type,
                              wasm.memories[0]->name);
    }
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("invalid type");
  }
  WASM_UNREACHABLE("invalid type");
}